

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::CumulativeReporterBase::sectionStarting
          (CumulativeReporterBase *this,SectionInfo *sectionInfo)

{
  bool bVar1;
  reference this_00;
  SectionNode *pSVar2;
  reference other;
  __normal_iterator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_*,_std::vector<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>_>
  local_118;
  BySectionInfo local_110;
  __normal_iterator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_*,_std::vector<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>_>
  local_108;
  __normal_iterator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_*,_std::vector<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>_>
  local_100;
  __normal_iterator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_*,_std::vector<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>_>
  local_f8;
  __normal_iterator<const_Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_*,_std::vector<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>_>
  local_f0;
  const_iterator it;
  SectionNode *parentNode;
  Ptr<Catch::CumulativeReporterBase::SectionNode> local_d0;
  Ptr<Catch::CumulativeReporterBase::SectionNode> node;
  undefined1 local_b0 [8];
  SectionStats incompleteStats;
  SectionInfo *sectionInfo_local;
  CumulativeReporterBase *this_local;
  
  incompleteStats._144_8_ = sectionInfo;
  Counts::Counts((Counts *)&node);
  SectionStats::SectionStats((SectionStats *)local_b0,sectionInfo,(Counts *)&node,0.0,false);
  Ptr<Catch::CumulativeReporterBase::SectionNode>::Ptr(&local_d0);
  bVar1 = std::
          vector<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
          ::empty(&this->m_sectionStack);
  if (bVar1) {
    bVar1 = Ptr<Catch::CumulativeReporterBase::SectionNode>::operator!(&this->m_rootSection);
    if (bVar1) {
      pSVar2 = (SectionNode *)operator_new(0x118);
      SectionNode::SectionNode(pSVar2,(SectionStats *)local_b0);
      Ptr<Catch::CumulativeReporterBase::SectionNode>::operator=(&this->m_rootSection,pSVar2);
    }
    Ptr<Catch::CumulativeReporterBase::SectionNode>::operator=(&local_d0,&this->m_rootSection);
  }
  else {
    this_00 = std::
              vector<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
              ::back(&this->m_sectionStack);
    it._M_current =
         (Ptr<Catch::CumulativeReporterBase::SectionNode> *)
         Ptr<Catch::CumulativeReporterBase::SectionNode>::operator*(this_00);
    local_100._M_current =
         (Ptr<Catch::CumulativeReporterBase::SectionNode> *)
         std::
         vector<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
         ::begin(&((SectionNode *)it._M_current)->childSections);
    local_108._M_current =
         (Ptr<Catch::CumulativeReporterBase::SectionNode> *)
         std::
         vector<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
         ::end((vector<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
                *)(it._M_current + 0x15));
    BySectionInfo::BySectionInfo(&local_110,(SectionInfo *)incompleteStats._144_8_);
    local_f8 = std::
               find_if<__gnu_cxx::__normal_iterator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>*,std::vector<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>>>>,Catch::CumulativeReporterBase::BySectionInfo>
                         (local_100,local_108,&local_110);
    __gnu_cxx::
    __normal_iterator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>const*,std::vector<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>>>>
    ::__normal_iterator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>*>
              ((__normal_iterator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>const*,std::vector<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>>>>
                *)&local_f0,&local_f8);
    local_118._M_current =
         (Ptr<Catch::CumulativeReporterBase::SectionNode> *)
         std::
         vector<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
         ::end((vector<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
                *)(it._M_current + 0x15));
    bVar1 = __gnu_cxx::operator==(&local_f0,&local_118);
    if (bVar1) {
      pSVar2 = (SectionNode *)operator_new(0x118);
      SectionNode::SectionNode(pSVar2,(SectionStats *)local_b0);
      Ptr<Catch::CumulativeReporterBase::SectionNode>::operator=(&local_d0,pSVar2);
      std::
      vector<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
      ::push_back((vector<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
                   *)(it._M_current + 0x15),&local_d0);
    }
    else {
      other = __gnu_cxx::
              __normal_iterator<const_Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_*,_std::vector<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>_>
              ::operator*(&local_f0);
      Ptr<Catch::CumulativeReporterBase::SectionNode>::operator=(&local_d0,other);
    }
  }
  std::
  vector<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
  ::push_back(&this->m_sectionStack,&local_d0);
  Ptr<Catch::CumulativeReporterBase::SectionNode>::operator=(&this->m_deepestSection,&local_d0);
  Ptr<Catch::CumulativeReporterBase::SectionNode>::~Ptr(&local_d0);
  SectionStats::~SectionStats((SectionStats *)local_b0);
  return;
}

Assistant:

virtual void sectionStarting( SectionInfo const& sectionInfo ) CATCH_OVERRIDE {
            SectionStats incompleteStats( sectionInfo, Counts(), 0, false );
            Ptr<SectionNode> node;
            if( m_sectionStack.empty() ) {
                if( !m_rootSection )
                    m_rootSection = new SectionNode( incompleteStats );
                node = m_rootSection;
            }
            else {
                SectionNode& parentNode = *m_sectionStack.back();
                SectionNode::ChildSections::const_iterator it =
                    std::find_if(   parentNode.childSections.begin(),
                                    parentNode.childSections.end(),
                                    BySectionInfo( sectionInfo ) );
                if( it == parentNode.childSections.end() ) {
                    node = new SectionNode( incompleteStats );
                    parentNode.childSections.push_back( node );
                }
                else
                    node = *it;
            }
            m_sectionStack.push_back( node );
            m_deepestSection = node;
        }